

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptConversion.cpp
# Opt level: O2

int64 Js::JavascriptConversion::ToLength(Var aValue,ScriptContext *scriptContext)

{
  bool bVar1;
  BOOL BVar2;
  int64 iVar3;
  INT64 IVar4;
  double value;
  double T1;
  
  bVar1 = TaggedInt::Is(aValue);
  if (bVar1) {
    iVar3 = TaggedInt::ToInt64(aValue);
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    return iVar3;
  }
  value = ToInteger(aValue,scriptContext);
  T1 = 0.0;
  if (0.0 <= value) {
    BVar2 = JavascriptNumber::IsNegZero(value);
    T1 = 0.0;
    if (BVar2 == 0) {
      T1 = value;
      if (9007199254740991.0 < value) {
        T1 = 9007199254740991.0;
      }
    }
  }
  IVar4 = NumberUtilities::TryToInt64(T1);
  return IVar4;
}

Assistant:

int64 JavascriptConversion::ToLength(Var aValue, ScriptContext* scriptContext)
    {
        if (TaggedInt::Is(aValue))
        {
            int64 length = TaggedInt::ToInt64(aValue);
            return (length < 0) ? 0 : length;
        }

        double length = JavascriptConversion::ToInteger(aValue, scriptContext);

        if (length < 0.0 || JavascriptNumber::IsNegZero(length))
        {
            length = 0.0;
        }
        else if (length > Math::MAX_SAFE_INTEGER)
        {
            length = Math::MAX_SAFE_INTEGER;
        }

        return NumberUtilities::TryToInt64(length);
    }